

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# substring.cpp
# Opt level: O2

string_t __thiscall
duckdb::SubstringUnicode(duckdb *this,Vector *result,string_t input,int64_t offset,int64_t length)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong offset_00;
  long lVar5;
  long lVar6;
  char *input_data;
  ulong input_size;
  bool bVar7;
  anon_union_16_2_67f50693_for_value aVar8;
  string_t input_local;
  
  lVar6 = input.value._8_8_;
  input_local.value.pointer.ptr = (char *)input.value._0_8_;
  input_data = input_local.value.pointer.prefix;
  if (0xc < (uint)result) {
    input_data = input_local.value.pointer.ptr;
  }
  input_size = (ulong)result & 0xffffffff;
  input_local.value._0_8_ = result;
  AssertInSupportedRange(input_size,lVar6,offset);
  if (offset != 0) {
    if (lVar6 < 0) {
      lVar6 = 1 - lVar6;
      lVar3 = lVar6 - offset;
      if (offset < 0) {
        lVar3 = lVar6;
        lVar6 = lVar6 - offset;
      }
      uVar2 = 0xffffffffffffffff;
      if (lVar3 < 1) {
        uVar2 = input_size;
      }
      lVar5 = 0;
      offset_00 = input_size;
      while ((offset_00 != 0 && (lVar5 = lVar5 + 1, lVar5 != lVar6))) {
        if (lVar5 == lVar3) {
          uVar2 = offset_00;
        }
        offset_00 = offset_00 - 1;
      }
      uVar4 = input_size;
      if (input_size < uVar2) {
        uVar4 = uVar2;
      }
      if ((uVar2 < input_size) || (bVar7 = uVar2 != 0xffffffffffffffff, uVar2 = uVar4, bVar7))
      goto LAB_0184e188;
    }
    else {
      lVar6 = lVar6 + -1;
      if (offset < 0) {
        lVar3 = 0;
        if (0 < offset + lVar6) {
          lVar3 = offset + lVar6;
        }
      }
      else {
        lVar3 = 0;
        if (0 < lVar6) {
          lVar3 = lVar6;
        }
        lVar6 = lVar6 + offset;
      }
      offset_00 = 0xffffffffffffffff;
      uVar4 = 0;
      for (lVar5 = 0;
          (uVar2 = input_size, input_size != uVar4 &&
          ((uVar1 = uVar4, lVar5 == lVar3 || (uVar2 = uVar4, uVar1 = offset_00, lVar5 != lVar6))));
          lVar5 = lVar5 + 1) {
        offset_00 = uVar1;
        uVar4 = uVar4 + 1;
      }
      if ((offset_00 != 0xffffffffffffffff) && (lVar3 < lVar6)) {
LAB_0184e188:
        aVar8.pointer =
             (anon_struct_16_3_d7536bce_for_pointer)
             SubstringSlice((Vector *)this,input_data,offset_00,uVar2 - offset_00);
        return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar8.pointer
        ;
      }
    }
  }
  aVar8.pointer = (anon_struct_16_3_d7536bce_for_pointer)SubstringEmptyString((Vector *)this);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar8.pointer;
}

Assistant:

string_t SubstringUnicode(Vector &result, string_t input, int64_t offset, int64_t length) {
	auto input_data = input.GetData();
	auto input_size = input.GetSize();

	AssertInSupportedRange(input_size, offset, length);

	if (length == 0) {
		return SubstringEmptyString(result);
	}
	// first figure out which direction we need to scan
	idx_t start_pos;
	idx_t end_pos;
	if (offset < 0) {
		start_pos = 0;
		end_pos = DConstants::INVALID_INDEX;

		// negative offset: scan backwards
		int64_t start, end;

		// we express start and end as unicode codepoints from the back
		offset--;
		if (length < 0) {
			// negative length
			start = -offset - length;
			end = -offset;
		} else {
			// positive length
			start = -offset;
			end = -offset - length;
		}
		if (end <= 0) {
			end_pos = input_size;
		}
		int64_t current_character = 0;
		for (idx_t i = input_size; i > 0; i--) {
			if (IsCharacter(input_data[i - 1])) {
				current_character++;
				if (current_character == start) {
					start_pos = i;
					break;
				} else if (current_character == end) {
					end_pos = i;
				}
			}
		}
		while (!IsCharacter(input_data[start_pos])) {
			start_pos++;
		}
		while (end_pos < input_size && !IsCharacter(input_data[end_pos])) {
			end_pos++;
		}

		if (end_pos == DConstants::INVALID_INDEX) {
			return SubstringEmptyString(result);
		}
	} else {
		start_pos = DConstants::INVALID_INDEX;
		end_pos = input_size;

		// positive offset: scan forwards
		int64_t start, end;

		// we express start and end as unicode codepoints from the front
		offset--;
		if (length < 0) {
			// negative length
			start = MaxValue<int64_t>(0, offset + length);
			end = offset;
		} else {
			// positive length
			start = MaxValue<int64_t>(0, offset);
			end = offset + length;
		}

		int64_t current_character = 0;
		for (idx_t i = 0; i < input_size; i++) {
			if (IsCharacter(input_data[i])) {
				if (current_character == start) {
					start_pos = i;
				} else if (current_character == end) {
					end_pos = i;
					break;
				}
				current_character++;
			}
		}
		if (start_pos == DConstants::INVALID_INDEX || end == 0 || end <= start) {
			return SubstringEmptyString(result);
		}
	}
	D_ASSERT(end_pos >= start_pos);
	// after we have found these, we can slice the substring
	return SubstringSlice(result, input_data, UnsafeNumericCast<int64_t>(start_pos),
	                      UnsafeNumericCast<int64_t>(end_pos - start_pos));
}